

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O1

void __thiscall CDirectivePosition::exec(CDirectivePosition *this)

{
  if (this->type == Virtual) {
    FileManager::seekVirtual(g_fileManager,this->position);
    return;
  }
  if (this->type == Physical) {
    FileManager::seekPhysical(g_fileManager,this->position);
    return;
  }
  return;
}

Assistant:

void CDirectivePosition::exec() const
{
	switch (type)
	{
	case Physical:
		g_fileManager->seekPhysical(position);
		break;
	case Virtual:
		g_fileManager->seekVirtual(position);
		break;
	}
}